

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# callback.c
# Opt level: O2

void delete_callbacks_for_context(void *ctx)

{
  callback *pcVar1;
  callback *ptr;
  callback *pcVar2;
  callback *pcVar3;
  
  ptr = (callback *)0x0;
  pcVar1 = cbhead;
  cbhead = (callback *)0x0;
  while (pcVar3 = cbhead, cbhead = pcVar1, pcVar2 = ptr, ptr = cbhead, cbhead != (callback *)0x0) {
    pcVar1 = cbhead->next;
    if ((cbhead->ctx == ctx) ||
       ((cbhead->fn == run_idempotent_callback && (*(void **)((long)cbhead->ctx + 8) == ctx)))) {
      cbhead = pcVar1;
      safefree(ptr);
      ptr = pcVar2;
      pcVar1 = cbhead;
      cbhead = pcVar3;
    }
    else if (pcVar3 != (callback *)0x0) {
      pcVar2->next = cbhead;
      cbhead = pcVar1;
      pcVar1 = cbhead;
      cbhead = pcVar3;
    }
  }
  cbhead = pcVar3;
  cbtail = pcVar2;
  if (pcVar2 != (callback *)0x0) {
    pcVar2->next = (callback *)0x0;
  }
  return;
}

Assistant:

void delete_callbacks_for_context(void *ctx)
{
    struct callback *newhead, *newtail;

    newhead = newtail = NULL;
    while (cbhead) {
        struct callback *cb = cbhead;
        cbhead = cbhead->next;
        if (cb->ctx == ctx ||
            (cb->fn == run_idempotent_callback &&
             ((struct IdempotentCallback *)cb->ctx)->ctx == ctx)) {
            sfree(cb);
        } else {
            if (!newhead)
                newhead = cb;
            else
                newtail->next = cb;

            newtail = cb;
        }
    }

    cbhead = newhead;
    cbtail = newtail;
    if (newtail)
        newtail->next = NULL;
}